

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O0

size_t __thiscall hrvo::Simulator::addAgent(Simulator *this,Vector2 *position,size_t goalNo)

{
  runtime_error *this_00;
  size_type sVar1;
  vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_> *in_RDI;
  Agent *agent;
  value_type *in_stack_ffffffffffffff98;
  allocator *paVar2;
  size_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Simulator *in_stack_ffffffffffffffb8;
  Agent *in_stack_ffffffffffffffc0;
  string local_38 [56];
  
  if ((in_RDI->super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>)._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    paVar2 = (allocator *)&stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Agent defaults not set when adding agent.",paVar2);
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  operator_new(0xd8);
  Agent::Agent(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (Vector2 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::push_back
            (in_RDI,in_stack_ffffffffffffff98);
  sVar1 = std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::size
                    ((vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_> *)
                     &in_RDI[1].super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  return sVar1 - 1;
}

Assistant:

std::size_t Simulator::addAgent(const Vector2 &position, std::size_t goalNo) {
  if (defaults_ == NULL) {
    throw std::runtime_error("Agent defaults not set when adding agent.");
  }

  Agent *const agent = new Agent(this, position, goalNo);
  agents_.push_back(agent);

  return agents_.size() - 1U;
}